

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O2

void realloc_segmentation_maps(AV1_COMP *cpi)

{
  uint8_t *puVar1;
  CYCLIC_REFRESH *pCVar2;
  uchar *puVar3;
  
  aom_free((cpi->enc_seg).map);
  puVar1 = (uint8_t *)
           aom_calloc((long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows,
                      1);
  (cpi->enc_seg).map = puVar1;
  if (puVar1 == (uint8_t *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate cpi->enc_seg.map"
                      );
  }
  if (cpi->cyclic_refresh != (CYCLIC_REFRESH *)0x0) {
    av1_cyclic_refresh_free(cpi->cyclic_refresh);
  }
  pCVar2 = av1_cyclic_refresh_alloc((cpi->common).mi_params.mi_rows,(cpi->common).mi_params.mi_cols)
  ;
  cpi->cyclic_refresh = pCVar2;
  if (pCVar2 == (CYCLIC_REFRESH *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->cyclic_refresh");
  }
  aom_free((cpi->active_map).map);
  puVar3 = (uchar *)aom_calloc((long)(cpi->common).mi_params.mi_cols *
                               (long)(cpi->common).mi_params.mi_rows,1);
  (cpi->active_map).map = puVar3;
  if (puVar3 != (uchar *)0x0) {
    return;
  }
  aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                     "Failed to allocate cpi->active_map.map");
  return;
}

Assistant:

static inline void realloc_segmentation_maps(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CommonModeInfoParams *const mi_params = &cm->mi_params;

  // Create the encoder segmentation map and set all entries to 0
  aom_free(cpi->enc_seg.map);
  CHECK_MEM_ERROR(cm, cpi->enc_seg.map,
                  aom_calloc(mi_params->mi_rows * mi_params->mi_cols, 1));

  // Create a map used for cyclic background refresh.
  if (cpi->cyclic_refresh) av1_cyclic_refresh_free(cpi->cyclic_refresh);
  CHECK_MEM_ERROR(
      cm, cpi->cyclic_refresh,
      av1_cyclic_refresh_alloc(mi_params->mi_rows, mi_params->mi_cols));

  // Create a map used to mark inactive areas.
  aom_free(cpi->active_map.map);
  CHECK_MEM_ERROR(cm, cpi->active_map.map,
                  aom_calloc(mi_params->mi_rows * mi_params->mi_cols, 1));
}